

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O3

void __thiscall OPLmusicBlock::OffsetSamples(OPLmusicBlock *this,float *buff,int count)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (count < 1) {
    uVar1 = 0;
    dVar7 = 10000000000.0;
    dVar8 = -10000000000.0;
  }
  else {
    dVar8 = -10000000000.0;
    dVar7 = 10000000000.0;
    uVar3 = 0;
    uVar4 = 0;
    do {
      dVar5 = (double)buff[uVar3];
      if (dVar8 < dVar5) {
        uVar4 = uVar3 & 0xffffffff;
      }
      if (dVar5 < dVar7) {
        uVar4 = uVar3 & 0xffffffff;
      }
      uVar1 = (uint)uVar4;
      if (dVar8 <= dVar5) {
        dVar8 = dVar5;
      }
      if (dVar5 <= dVar7) {
        dVar7 = dVar5;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)count != uVar3);
  }
  dVar5 = this->LastOffset;
  dVar6 = 0.0;
  if ((((dVar5 != 0.0) || (dVar7 < -1.1)) || (1.1 < dVar8)) &&
     (dVar6 = (dVar7 + dVar8) * 0.5, ABS(dVar6) < 0.00390625)) {
    dVar6 = 0.0;
  }
  if (count < 0x200) {
    uVar2 = 0xc4;
    if (0xc4 < (int)uVar1) {
      uVar2 = uVar1;
    }
    if (count < (int)uVar2) {
      uVar2 = count;
    }
    dVar7 = (dVar6 - dVar5) / (double)(int)uVar2;
  }
  else {
    dVar7 = (dVar6 - dVar5) * 0.001953125;
    uVar2 = 0x200;
  }
  uVar1 = 0;
  if ((dVar7 != 0.0) && (0 < (int)uVar2)) {
    uVar4 = 0;
    do {
      buff[uVar4] = (float)((double)buff[uVar4] - dVar5);
      dVar5 = dVar5 + dVar7;
      uVar4 = uVar4 + 1;
      uVar1 = uVar2;
    } while (uVar2 != uVar4);
  }
  if ((dVar5 != 0.0) && ((int)uVar1 < count)) {
    uVar4 = (ulong)uVar1;
    do {
      buff[uVar4] = (float)((double)buff[uVar4] - dVar5);
      uVar4 = uVar4 + 1;
    } while ((uint)count != uVar4);
  }
  this->LastOffset = (double)(float)dVar5;
  return;
}

Assistant:

void OPLmusicBlock::OffsetSamples(float *buff, int count)
{
	// Three out of four of the OPL waveforms are non-negative. Depending on
	// timbre selection, this can cause the output waveform to tend toward
	// very large positive values. Heretic's music is particularly bad for
	// this. This function attempts to compensate by offseting the sample
	// data back to around the [-1.0, 1.0] range.

	double max = -1e10, min = 1e10, offset, step;
	int i, ramp, largest_at = 0;

	// Find max and min values for this segment of the waveform.
	for (i = 0; i < count; ++i)
	{
		if (buff[i] > max)
		{
			max = buff[i];
			largest_at = i;
		}
		if (buff[i] < min)
		{
			min = buff[i];
			largest_at = i;
		}
	}
	// Prefer to keep the offset at 0, even if it means a little clipping.
	if (LastOffset == 0 && min >= -1.1 && max <= 1.1)
	{
		offset = 0;
	}
	else
	{
		offset = (max + min) / 2;
		// If the new offset is close to 0, make it 0 to avoid making another
		// full loop through the sample data.
		if (fabs(offset) < 1/256.0)
		{
			offset = 0;
		}
	}
	// Ramp the offset change so there aren't any abrupt clicks in the output.
	// If the ramp is too short, it can sound scratchy. cblood2.mid is
	// particularly unforgiving of short ramps.
	if (count >= 512)
	{
		ramp = 512;
		step = (offset - LastOffset) / 512;
	}
	else
	{
		ramp = MIN(count, MAX(196, largest_at));
		step = (offset - LastOffset) / ramp;
	}
	offset = LastOffset;
	i = 0;
	if (step != 0)
	{
		for (; i < ramp; ++i)
		{
			buff[i] = float(buff[i] - offset);
			offset += step;
		}
	}
	if (offset != 0)
	{
		for (; i < count; ++i)
		{
			buff[i] = float(buff[i] - offset);
		}
	}
	LastOffset = float(offset);
}